

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O2

QLayoutItem * __thiscall QDockWidgetLayout::itemAt(QDockWidgetLayout *this,int index)

{
  QLayoutItem *pQVar1;
  QLayoutItem *in_RAX;
  QLayoutItem *pQVar2;
  long lVar3;
  int iVar4;
  
  lVar3 = 0;
  iVar4 = 0;
  while( true ) {
    if ((this->item_list).d.size == lVar3) {
      return (QLayoutItem *)0x0;
    }
    pQVar1 = (this->item_list).d.ptr[lVar3];
    pQVar2 = in_RAX;
    if (iVar4 == index) {
      pQVar2 = pQVar1;
    }
    if (pQVar1 != (QLayoutItem *)0x0) {
      in_RAX = pQVar2;
    }
    if (pQVar1 != (QLayoutItem *)0x0 && iVar4 == index) break;
    iVar4 = (iVar4 + 1) - (uint)(pQVar1 == (QLayoutItem *)0x0);
    lVar3 = lVar3 + 1;
  }
  return in_RAX;
}

Assistant:

QLayoutItem *QDockWidgetLayout::itemAt(int index) const
{
    int cnt = 0;
    for (int i = 0; i < item_list.size(); ++i) {
        QLayoutItem *item = item_list.at(i);
        if (item == nullptr)
            continue;
        if (index == cnt++)
            return item;
    }
    return nullptr;
}